

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

int cram_add_bases(cram_fd *fd,cram_container *c,cram_slice *s,cram_record *r,int pos,int len,
                  char *base)

{
  int iVar1;
  undefined1 local_40 [8];
  cram_feature f;
  int len_local;
  int pos_local;
  cram_record *r_local;
  cram_slice *s_local;
  cram_container *c_local;
  cram_fd *fd_local;
  
  local_40._0_4_ = pos + 1;
  local_40._4_4_ = 0x62;
  f.field_0.X.pos = (int)base - (int)s->seqs_blk->data;
  f.field_0.X.code = len;
  f.field_0.X.base = len;
  f.field_0.B.qual = pos;
  iVar1 = cram_add_feature(c,s,r,(cram_feature *)local_40);
  return iVar1;
}

Assistant:

static int cram_add_bases(cram_fd *fd, cram_container *c,
			  cram_slice *s, cram_record *r,
			  int pos, int len, char *base) {
    cram_feature f;

    f.b.pos = pos+1;
    f.b.code = 'b';
    f.b.seq_idx = base - (char *)BLOCK_DATA(s->seqs_blk);
    f.b.len = len;

    return cram_add_feature(c, s, r, &f);
}